

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_decode_file(uchar **out,uint *w,uint *h,char *filename,LodePNGColorType colortype,
                        uint bitdepth)

{
  uint uVar1;
  uchar *buffer;
  size_t buffersize;
  uchar *local_40;
  size_t local_38;
  
  local_40 = (uchar *)0x0;
  *out = (uchar *)0x0;
  *h = 0;
  *w = 0;
  uVar1 = lodepng_load_file(&local_40,&local_38,filename);
  if (uVar1 == 0) {
    uVar1 = lodepng_decode_memory(out,w,h,local_40,local_38,colortype,bitdepth);
  }
  free(local_40);
  return uVar1;
}

Assistant:

unsigned lodepng_decode_file(unsigned char** out, unsigned* w, unsigned* h, const char* filename,
                             LodePNGColorType colortype, unsigned bitdepth) {
  unsigned char* buffer = 0;
  size_t buffersize;
  unsigned error;
  /* safe output values in case error happens */
  *out = 0;
  *w = *h = 0;
  error = lodepng_load_file(&buffer, &buffersize, filename);
  if(!error) error = lodepng_decode_memory(out, w, h, buffer, buffersize, colortype, bitdepth);
  lodepng_free(buffer);
  return error;
}